

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

char * Json::duplicateStringValue(char *value,size_t length)

{
  allocator local_41;
  string local_40;
  char *local_20;
  char *newString;
  size_t length_local;
  char *value_local;
  
  newString = (char *)length;
  if (0x7ffffffe < length) {
    newString = (char *)0x7ffffffe;
  }
  length_local = (size_t)value;
  local_20 = (char *)malloc((size_t)(newString + 1));
  if (local_20 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,
               "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer",
               &local_41);
    throwRuntimeError(&local_40);
  }
  memcpy(local_20,(void *)length_local,(size_t)newString);
  local_20[(long)newString] = '\0';
  return local_20;
}

Assistant:

static inline char* duplicateStringValue(const char* value,
                                         size_t length)
{
  // Avoid an integer overflow in the call to malloc below by limiting length
  // to a sane value.
  if (length >= static_cast<size_t>(Value::maxInt))
    length = Value::maxInt - 1;

  char* newString = static_cast<char*>(malloc(length + 1));
  if (newString == NULL) {
    throwRuntimeError(
        "in Json::Value::duplicateStringValue(): "
        "Failed to allocate string value buffer");
  }
  memcpy(newString, value, length);
  newString[length] = 0;
  return newString;
}